

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::XThreadEvent::fire(XThreadEvent *this)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_00;
  long *plVar1;
  PromiseNode *pPVar2;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *pEVar3;
  long *in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar4;
  NullableValue<kj::Exception> _exception1145;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OStack_4e8;
  NullableValue<kj::Exception> local_4e0;
  NullableValue<kj::Exception> local_348;
  
  this_00 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(in_RSI + 0xf);
  plVar1 = (long *)in_RSI[0xf];
  if (plVar1 == (long *)0x0) {
    (**(code **)(*in_RSI + 0x28))(&OStack_4e8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=(this_00,&OStack_4e8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&OStack_4e8);
    local_348.isSet = false;
    NullableValue<kj::Exception>::NullableValue(&local_4e0,&local_348);
    NullableValue<kj::Exception>::~NullableValue(&local_348);
    if (local_4e0.isSet == true) {
      ExceptionOrValue::addException((ExceptionOrValue *)in_RSI[10],&local_4e0.field_1.value);
    }
    NullableValue<kj::Exception>::~NullableValue(&local_4e0);
    pPVar2 = this_00->ptr;
    if (pPVar2 != (PromiseNode *)0x0) {
      (*(pPVar2->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])
                (pPVar2,(PromiseArena *)(in_RSI + 2));
      (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)0x0;
      (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
      pEVar3 = extraout_RDX_00;
      goto LAB_0035869a;
    }
    (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&fire::DISPOSER;
    (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)(in_RSI + 2);
  }
  else {
    (**(code **)(*plVar1 + 0x18))(plVar1,in_RSI[10]);
    local_4e0._0_8_ = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              (this_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_4e0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_4e0);
    (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&fire::DISPOSER;
    (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)(in_RSI + 2);
  }
  local_4e0.field_1.value.ownFile.content.ptr = (char *)0x0;
  local_4e0._0_8_ = &fire::DISPOSER;
  Own<kj::_::Event,_std::nullptr_t>::dispose((Own<kj::_::Event,_std::nullptr_t> *)&local_4e0);
  pEVar3 = extraout_RDX;
LAB_0035869a:
  MVar4.ptr.ptr = pEVar3;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

Maybe<Own<Event>> XThreadEvent::fire() {
  static constexpr DelayedDoneHack DISPOSER {};

  KJ_IF_SOME(n, promiseNode) {
    n->get(result);
    promiseNode = kj::none;  // make sure to destroy in the thread that created it
    return Own<Event>(this, DISPOSER);
  } else {
    KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
      promiseNode = execute();
    })) {
      result.addException(kj::mv(exception));
    };
    KJ_IF_SOME(n, promiseNode) {
      n->onReady(this);
    } else {
      return Own<Event>(this, DISPOSER);
    }
  }